

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NwnStreams.h
# Opt level: O0

size_t __thiscall CNwnMemoryStream::Read(CNwnMemoryStream *this,void *pBuffer,size_t nCount)

{
  ulong uVar1;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t nRemaining;
  undefined8 local_18;
  
  uVar1 = *(long *)(in_RDI + 0x38) - *(long *)(in_RDI + 0x30);
  local_18 = in_RDX;
  if (uVar1 < in_RDX) {
    local_18 = uVar1;
  }
  memcpy(in_RSI,*(void **)(in_RDI + 0x30),local_18);
  *(ulong *)(in_RDI + 0x30) = local_18 + *(long *)(in_RDI + 0x30);
  return local_18;
}

Assistant:

virtual size_t Read (void *pBuffer, size_t nCount)
	{
		size_t nRemaining = m_pauchEnd - m_pauchPos;
		if (nRemaining < nCount)
			nCount = nRemaining;
		memcpy (pBuffer, m_pauchPos, nCount);
		m_pauchPos += nCount;
		return nCount;
    }